

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

BYTE HexToByte(char *hex)

{
  char cVar1;
  int local_18;
  BYTE local_11;
  int i;
  BYTE v;
  char *hex_local;
  
  local_11 = '\0';
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    if ((hex[local_18] < '0') || ('9' < hex[local_18])) {
      if ((hex[local_18] < 'A') || ('F' < hex[local_18])) {
        cVar1 = hex[local_18] + -0x61;
      }
      else {
        cVar1 = hex[local_18] + -0x41;
      }
    }
    else {
      cVar1 = hex[local_18] + -0x30;
    }
    local_11 = local_11 * '\x10' + cVar1;
  }
  return local_11;
}

Assistant:

static BYTE HexToByte (const char *hex)
{
	BYTE v = 0;
	for (int i = 0; i < 2; ++i)
	{
		v <<= 4;
		if (hex[i] >= '0' && hex[i] <= '9')
		{
			v += hex[i] - '0';
		}
		else if (hex[i] >= 'A' && hex[i] <= 'F')
		{
			v += hex[i] - 'A';
		}
		else // The string is already verified to contain valid hexits
		{
			v += hex[i] - 'a';
		}
	}
	return v;
}